

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::
OP_SimdShuffleV8X16<Js::OpLayoutT_AsmShuffle<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_AsmShuffle<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  ushort uVar1;
  code *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  byte bVar5;
  undefined4 *puVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  SIMDValue src2;
  SIMDValue SVar10;
  uint32 local_78 [2];
  uint32 lanes [16];
  
  lanes._56_8_ = this;
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  lVar9 = 0;
  do {
    bVar5 = playout->INDICES[lVar9];
    if (0x1f < bVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x20d5,"(playout->INDICES[i] < Wasm::Simd::MAX_LANES * 2)",
                                  "playout->INDICES[i] < Wasm::Simd::MAX_LANES * 2");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
      bVar5 = playout->INDICES[lVar9];
    }
    uVar3 = lanes._56_8_;
    local_78[lVar9] = (uint)bVar5;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x10);
  uVar1 = playout->R0;
  lVar9 = *(long *)(lanes._56_8_ + 0x148);
  lVar7 = (ulong)playout->R1 * 0x10;
  lVar8 = (ulong)playout->R2 * 0x10;
  SVar10.field_0.f64[1] = (Type)*(undefined8 *)(lVar9 + 8 + lVar7);
  SVar10.field_0.f64[0] = (Type)*(undefined8 *)(lVar9 + lVar7);
  src2.field_0.f64[1] = (Type)*(undefined8 *)(lVar9 + 8 + lVar8);
  src2.field_0.f64[0] = (Type)*(undefined8 *)(lVar9 + lVar8);
  SVar10 = SIMDUtils::SIMD128InnerShuffle(SVar10,src2,0x10,local_78);
  lVar9 = *(long *)(uVar3 + 0x148);
  lVar7 = (ulong)uVar1 * 0x10;
  *(long *)(lVar9 + lVar7) = SVar10.field_0._0_8_;
  *(long *)(lVar9 + 8 + lVar7) = SVar10.field_0._8_8_;
  return;
}

Assistant:

void InterpreterStackFrame::OP_SimdShuffleV8X16(const unaligned T* playout)
    {
        uint32 lanes[Wasm::Simd::MAX_LANES];
        for (uint32 i = 0; i < Wasm::Simd::MAX_LANES; i++)
        {
            Assert(playout->INDICES[i] < Wasm::Simd::MAX_LANES * 2);
            lanes[i] = playout->INDICES[i];
        }
        SetRegRawSimd(playout->R0, SIMDUtils::SIMD128InnerShuffle(GetRegRawSimd(playout->R1), GetRegRawSimd(playout->R2), Wasm::Simd::MAX_LANES, lanes));
    }